

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void us32_to_us16_test(int line,UTF_US32 *str1,UTF_US16 *str2,bool ok)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  char16_t *pcVar4;
  long lVar5;
  uint unaff_EBP;
  long lVar6;
  long lVar7;
  char16_t cVar8;
  ushort uVar9;
  uint uVar10;
  uint unaff_R14D;
  bool bVar11;
  UTF_US16 tmp;
  UTF_UC16 buf [256];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_260;
  UTF_US16 *local_240;
  char16_t local_238 [260];
  
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = L'\0';
  sVar1 = str1->_M_string_length;
  local_240 = str2;
  if (sVar1 != 0) {
    pcVar2 = (str1->_M_dataplus)._M_p;
    lVar5 = 0;
    do {
      uVar10 = *(uint *)((long)pcVar2 + lVar5);
      if (uVar10 < 0x110000) {
        if (uVar10 < 0x10000) {
          unaff_R14D = 0;
          unaff_EBP = uVar10;
        }
        else {
          unaff_EBP = (uVar10 + 0x3ff0000 >> 10) - 0x2800;
          unaff_R14D = uVar10 & 0x3ff | 0xdc00;
        }
      }
      cVar8 = L'?';
      if (uVar10 < 0x110000) {
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::push_back(&local_260,(char16_t)unaff_EBP);
        cVar8 = (char16_t)unaff_R14D;
        if (cVar8 != L'\0') goto LAB_00102387;
      }
      else {
LAB_00102387:
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::push_back(&local_260,cVar8);
      }
      lVar5 = lVar5 + 4;
    } while (sVar1 << 2 != lVar5);
  }
  UTF_test(line,ok);
  iVar3 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::compare
                    (&local_260,local_240);
  UTF_test(line,iVar3 == 0);
  sVar1 = str1->_M_string_length;
  bVar11 = true;
  if (sVar1 == 0) {
    pcVar4 = local_238;
  }
  else {
    pcVar2 = (str1->_M_dataplus)._M_p;
    pcVar4 = local_238;
    lVar6 = 0;
    lVar5 = 0;
    do {
      uVar10 = *(uint *)((long)pcVar2 + lVar6);
      if (uVar10 < 0x110000) {
        if (uVar10 < 0x10000) goto LAB_00102431;
        cVar8 = (short)(uVar10 + 0x3ff0000 >> 10) + L'\xd800';
        uVar9 = (ushort)uVar10 & 0x3ff | 0xdc00;
      }
      else {
        uVar10 = 0x3f;
LAB_00102431:
        cVar8 = (char16_t)uVar10;
        uVar9 = 0;
      }
      if (lVar5 == 0x1fe) {
LAB_0010248c:
        bVar11 = false;
        break;
      }
      lVar7 = lVar5 + 2;
      *pcVar4 = cVar8;
      if (uVar9 != 0) {
        if (lVar7 == 0x1fe) {
          pcVar4 = (char16_t *)((long)local_238 + lVar5 + 2);
          goto LAB_0010248c;
        }
        *(ushort *)((long)local_238 + lVar5 + 2) = uVar9;
        lVar7 = lVar5 + 4;
      }
      pcVar4 = (char16_t *)((long)local_238 + lVar7);
      lVar6 = lVar6 + 4;
      lVar5 = lVar7;
    } while (sVar1 << 2 != lVar6);
  }
  *pcVar4 = L'\0';
  UTF_test(line,bVar11);
  cVar8 = *local_260._M_dataplus._M_p;
  if (cVar8 == L'\0') {
    pcVar4 = local_238;
  }
  else {
    pcVar4 = local_238;
    lVar5 = 0;
    while (*pcVar4 != L'\0') {
      bVar11 = local_260._M_string_length + 1 == lVar5;
      if ((cVar8 != *pcVar4) || (local_260._M_string_length + 1 == lVar5)) goto LAB_001024f4;
      pcVar4 = pcVar4 + 1;
      cVar8 = local_260._M_dataplus._M_p[lVar5 + 1];
      lVar5 = lVar5 + 1;
      if (cVar8 == L'\0') break;
    }
  }
  bVar11 = cVar8 == *pcVar4;
LAB_001024f4:
  UTF_test(line,bVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  return;
}

Assistant:

void us32_to_us16_test(int line, const UTF_US32& str1, const UTF_US16& str2, bool ok)
{
    UTF_US16 tmp;
    UTF_UC16 buf[256];
    UTF_test(line, UTF_U_to_u<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_uj32_to_uj16(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj16_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}